

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barcode.h
# Opt level: O0

void __thiscall
barcode_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::
computing_barcodes_in_dimension
          (barcode_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t> *this,
          unsigned_short dimension)

{
  ostream *this_00;
  void *this_01;
  ushort in_SI;
  long in_RDI;
  
  if ((*(ushort *)(in_RDI + 0x212) <= in_SI) && (in_SI <= *(ushort *)(in_RDI + 0x214))) {
    this_00 = std::operator<<((ostream *)(in_RDI + 8),"# persistence intervals in dimension ");
    this_01 = (void *)std::ostream::operator<<(this_00,in_SI);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  *(ushort *)(in_RDI + 0x210) = in_SI;
  return;
}

Assistant:

void computing_barcodes_in_dimension(unsigned short dimension) {
		if (dimension >= min_dimension && dimension <= max_dimension)
			file_output_t<Complex>::outstream << "# persistence intervals in dimension " << dimension << std::endl;
		current_dimension = dimension;
	}